

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmarker.c
# Opt level: O0

void emit_adobe_app14(j_compress_ptr cinfo)

{
  j_compress_ptr cinfo_local;
  
  emit_marker(cinfo,M_APP14);
  emit_2bytes(cinfo,0xe);
  emit_byte(cinfo,0x41);
  emit_byte(cinfo,100);
  emit_byte(cinfo,0x6f);
  emit_byte(cinfo,0x62);
  emit_byte(cinfo,0x65);
  emit_2bytes(cinfo,100);
  emit_2bytes(cinfo,0);
  emit_2bytes(cinfo,0);
  if (cinfo->jpeg_color_space == JCS_YCbCr) {
    emit_byte(cinfo,1);
  }
  else if (cinfo->jpeg_color_space == JCS_YCCK) {
    emit_byte(cinfo,2);
  }
  else {
    emit_byte(cinfo,0);
  }
  return;
}

Assistant:

LOCAL(void)
emit_adobe_app14 (j_compress_ptr cinfo)
/* Emit an Adobe APP14 marker */
{
  /*
   * Length of APP14 block	(2 bytes)
   * Block ID			(5 bytes - ASCII "Adobe")
   * Version Number		(2 bytes - currently 100)
   * Flags0			(2 bytes - currently 0)
   * Flags1			(2 bytes - currently 0)
   * Color transform		(1 byte)
   *
   * Although Adobe TN 5116 mentions Version = 101, all the Adobe files
   * now in circulation seem to use Version = 100, so that's what we write.
   *
   * We write the color transform byte as 1 if the JPEG color space is
   * YCbCr, 2 if it's YCCK, 0 otherwise.  Adobe's definition has to do with
   * whether the encoder performed a transformation, which is pretty useless.
   */
  
  emit_marker(cinfo, M_APP14);
  
  emit_2bytes(cinfo, 2 + 5 + 2 + 2 + 2 + 1); /* length */

  emit_byte(cinfo, 0x41);	/* Identifier: ASCII "Adobe" */
  emit_byte(cinfo, 0x64);
  emit_byte(cinfo, 0x6F);
  emit_byte(cinfo, 0x62);
  emit_byte(cinfo, 0x65);
  emit_2bytes(cinfo, 100);	/* Version */
  emit_2bytes(cinfo, 0);	/* Flags0 */
  emit_2bytes(cinfo, 0);	/* Flags1 */
  switch (cinfo->jpeg_color_space) {
  case JCS_YCbCr:
    emit_byte(cinfo, 1);	/* Color transform = 1 */
    break;
  case JCS_YCCK:
    emit_byte(cinfo, 2);	/* Color transform = 2 */
    break;
  default:
    emit_byte(cinfo, 0);	/* Color transform = 0 */
    break;
  }
}